

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O1

bool __thiscall GGSock::Communicator::Data::update(Data *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  bVar1 = this->isServer;
  if ((bVar1 == true) && (this->isListening == true)) {
    doListen(this);
    goto LAB_0010af3b;
  }
  if ((bVar1 == false) || ((this->isListening != false || (this->isConnected == false)))) {
    if ((bVar1 == false) && (this->isConnecting == true)) {
      doConnect(this);
      goto LAB_0010af3b;
    }
    if ((bVar1 != false || this->isConnecting != false) || (this->isConnected != true))
    goto LAB_0010af3b;
  }
  doRead(this);
LAB_0010af3b:
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutexSend);
  if (iVar2 == 0) {
    if ((this->isConnected == true) && (this->rbHead != this->rbEnd)) {
      doSend(this);
    }
    if (this->isConnected == false) {
      this->rbHead = this->rbEnd;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutexSend);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return true;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool update() {
            std::lock_guard<std::mutex> lock(mutex);
            if (isServer && isListening) {
                doListen();
            } else if (isServer && isListening == false && isConnected) {
                doRead();
            } else if (isServer == false && isConnecting) {
                doConnect();
            } else if (isServer == false && isConnecting == false && isConnected) {
                doRead();
            }
            {
                std::lock_guard<std::mutex> lock(mutexSend);
                if (isConnected && (rbHead != rbEnd)) {
                    doSend();
                }
                if (isConnected == false) {
                    rbHead = rbEnd;
                }
            }

            return true;
        }